

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O2

void __thiscall
btDbvtBroadphase::getBroadphaseAabb(btDbvtBroadphase *this,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btDbvtAabbMm *a;
  btDbvtAabbMm *b;
  btDbvtAabbMm local_48;
  btVector3 local_28;
  
  a = *(btDbvtAabbMm **)&this->field_0x8;
  b = *(btDbvtAabbMm **)&this->field_0x68;
  if (a == (btDbvtAabbMm *)0x0) {
    if (b == (btDbvtAabbMm *)0x0) {
      local_28.m_floats[0] = 0.0;
      local_28.m_floats[1] = 0.0;
      local_28.m_floats[2] = 0.0;
      local_28.m_floats[3] = 0.0;
      btDbvtAabbMm::FromCR(&local_48,&local_28,0.0);
    }
    else {
      local_48.mi.m_floats[0] = (b->mi).m_floats[0];
      local_48.mi.m_floats[1] = (b->mi).m_floats[1];
      local_48.mi.m_floats[2] = (b->mi).m_floats[2];
      local_48.mi.m_floats[3] = (b->mi).m_floats[3];
      local_48.mx.m_floats[0] = (b->mx).m_floats[0];
      local_48.mx.m_floats[1] = (b->mx).m_floats[1];
      local_48.mx.m_floats[2] = (b->mx).m_floats[2];
      local_48.mx.m_floats[3] = (b->mx).m_floats[3];
    }
  }
  else if (b == (btDbvtAabbMm *)0x0) {
    local_48.mi.m_floats[0] = (a->mi).m_floats[0];
    local_48.mi.m_floats[1] = (a->mi).m_floats[1];
    local_48.mi.m_floats[2] = (a->mi).m_floats[2];
    local_48.mi.m_floats[3] = (a->mi).m_floats[3];
    local_48.mx.m_floats[0] = (a->mx).m_floats[0];
    local_48.mx.m_floats[1] = (a->mx).m_floats[1];
    local_48.mx.m_floats[2] = (a->mx).m_floats[2];
    local_48.mx.m_floats[3] = (a->mx).m_floats[3];
  }
  else {
    Merge(a,b,&local_48);
  }
  *(ulong *)aabbMin->m_floats = CONCAT44(local_48.mi.m_floats[1],local_48.mi.m_floats[0]);
  *(ulong *)(aabbMin->m_floats + 2) = CONCAT44(local_48.mi.m_floats[3],local_48.mi.m_floats[2]);
  *(ulong *)aabbMax->m_floats = CONCAT44(local_48.mx.m_floats[1],local_48.mx.m_floats[0]);
  *(ulong *)(aabbMax->m_floats + 2) = CONCAT44(local_48.mx.m_floats[3],local_48.mx.m_floats[2]);
  return;
}

Assistant:

void							btDbvtBroadphase::getBroadphaseAabb(btVector3& aabbMin,btVector3& aabbMax) const
{

	ATTRIBUTE_ALIGNED16(btDbvtVolume)	bounds;

	if(!m_sets[0].empty())
		if(!m_sets[1].empty())	Merge(	m_sets[0].m_root->volume,
			m_sets[1].m_root->volume,bounds);
		else
			bounds=m_sets[0].m_root->volume;
	else if(!m_sets[1].empty())	bounds=m_sets[1].m_root->volume;
	else
		bounds=btDbvtVolume::FromCR(btVector3(0,0,0),0);
	aabbMin=bounds.Mins();
	aabbMax=bounds.Maxs();
}